

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O0

void __thiscall
Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::
FunctionWithComputedName
          (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
           *this,FunctionProxy *proxy,ScriptFunctionType *deferredPrototypeType)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *this_00;
  undefined4 *puVar3;
  nullptr_t local_28;
  ScriptFunctionType *local_20;
  ScriptFunctionType *deferredPrototypeType_local;
  FunctionProxy *proxy_local;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_> *this_local;
  
  local_20 = deferredPrototypeType;
  deferredPrototypeType_local = (ScriptFunctionType *)proxy;
  proxy_local = (FunctionProxy *)this;
  FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::FunctionWithHomeObj
            (&this->super_FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>,proxy,
             deferredPrototypeType);
  *(undefined ***)
   &(this->super_FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>).
    super_ScriptFunctionWithInlineCache.super_ScriptFunction.super_ScriptFunctionBase.
    super_JavascriptFunction.super_DynamicObject.super_RecyclableObject = &PTR_Finalize_01e36f38;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->computedNameVar,&local_28);
  this_00 = FunctionProxy::GetFunctionInfo((FunctionProxy *)deferredPrototypeType_local);
  bVar2 = FunctionInfo::HasComputedName(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x28,"(proxy->GetFunctionInfo()->HasComputedName())",
                                "proxy->GetFunctionInfo()->HasComputedName()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

FunctionWithComputedName(FunctionProxy * proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), computedNameVar(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasComputedName());
        }